

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
google::protobuf::internal::
GenericTypeHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::New(Arena *arena)

{
  ArenaImpl *in_RDI;
  size_t n;
  size_t in_stack_ffffffffffffff90;
  Arena *in_stack_ffffffffffffffa0;
  ArenaImpl *n_00;
  ArenaImpl *this;
  undefined8 local_38;
  
  if (in_RDI == (ArenaImpl *)0x0) {
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    std::__cxx11::string::string((string *)local_38);
  }
  else {
    n_00 = in_RDI;
    this = in_RDI;
    AlignUpTo8(0x20);
    Arena::AllocHook(in_stack_ffffffffffffffa0,(type_info *)in_RDI,in_stack_ffffffffffffff90);
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (this,(size_t)n_00,(_func_void_void_ptr *)in_stack_ffffffffffffffa0);
    std::__cxx11::string::string((string *)local_38);
  }
  return local_38;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return Arena::CreateMaybeMessage<Type>(arena);
  }